

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,SwitchNode *switchNode)

{
  ExpNode *pEVar1;
  CaseBlockNode *pCVar2;
  
  pEVar1 = switchNode->exp;
  if (pEVar1 == (ExpNode *)0x0) {
    visit((SemanticTypes *)switchNode);
  }
  else {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    if (switchNode->exp->type != 0xb) {
      visit((SemanticTypes *)switchNode);
    }
    (*(switchNode->super_StmtNode).super_ASTNode._vptr_ASTNode[2])
              (switchNode,(ulong)(uint)(switchNode->exp->super_StmtNode).super_ASTNode.line);
  }
  pCVar2 = switchNode->block;
  if (pCVar2 == (CaseBlockNode *)0x0) {
    visit((SemanticTypes *)switchNode);
  }
  else {
    breakDepth = breakDepth + 1;
    (*(pCVar2->super_ASTNode)._vptr_ASTNode[3])(pCVar2,this);
    breakDepth = breakDepth + -1;
  }
  return;
}

Assistant:

void SemanticTypes::visit(SwitchNode *switchNode) {

    if (switchNode->getExp() != NULL) {
        switchNode->getExp()->accept(this);
        if (switchNode->getExp()->getType() != INT) {
            fprintf(stderr, "[SEMANTIC ERROR - switchNode] CONDITION MUST BE INT, line: %d\n", switchNode->getLine());
        }

        switchNode->setLine(switchNode->getExp()->getLine());
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - switchNode] NO VALID CONDITION, line: %d\n", switchNode->getLine());
    }
    if (switchNode->getBlock() != NULL) {
        breakDepth += 1;
        switchNode->getBlock()->accept(this);
        breakDepth -= 1;
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - switchNode] CASE STATEMENT REQUIRED, line: %d\n", switchNode->getLine());
    }
}